

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O1

void bk_lib::detail::fill<Clasp::ShortImplicationsGraph::ImplicationList>
               (ImplicationList *first,ImplicationList *last,ImplicationList *x)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ImplicationList *extraout_RDX;
  ImplicationList *pIVar4;
  ImplicationList *extraout_RDX_00;
  ImplicationList *extraout_RDX_01;
  ImplicationList *extraout_RDX_02;
  ImplicationList *extraout_RDX_03;
  ImplicationList *extraout_RDX_04;
  ImplicationList *extraout_RDX_05;
  ImplicationList *extraout_RDX_06;
  ImplicationList *pIVar5;
  
  pIVar4 = x;
  pIVar5 = first;
  switch((uint)((int)last - (int)first) >> 6 & 7) {
  case 0:
    while (pIVar5 != last) {
      first = pIVar5 + 1;
      uVar1 = *(undefined8 *)
               &(x->super_ImpListBase).super_type.
                super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                field_0x14;
      uVar2 = *(undefined8 *)&(x->super_ImpListBase).super_type.field_0x1c;
      uVar3 = *(undefined8 *)&(x->super_ImpListBase).super_type.field_0x2c;
      *(undefined8 *)&(pIVar5->super_ImpListBase).super_type.field_0x24 =
           *(undefined8 *)&(x->super_ImpListBase).super_type.field_0x24;
      *(undefined8 *)&(pIVar5->super_ImpListBase).super_type.field_0x2c = uVar3;
      *(undefined8 *)
       &(pIVar5->super_ImpListBase).super_type.
        super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.field_0x14
           = uVar1;
      *(undefined8 *)&(pIVar5->super_ImpListBase).super_type.field_0x1c = uVar2;
      left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U>::copy
                (&pIVar5->super_ImpListBase,(EVP_PKEY_CTX *)x,(EVP_PKEY_CTX *)pIVar4);
      (pIVar5->learnt)._M_b._M_p = (__pointer_type)0x0;
      LOCK();
      (pIVar5->learnt)._M_b._M_p = (x->learnt)._M_b._M_p;
      UNLOCK();
      pIVar4 = extraout_RDX;
switchD_00163aa8_caseD_7:
      pIVar5 = first + 1;
      uVar1 = *(undefined8 *)
               &(x->super_ImpListBase).super_type.
                super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                field_0x14;
      uVar2 = *(undefined8 *)&(x->super_ImpListBase).super_type.field_0x1c;
      uVar3 = *(undefined8 *)&(x->super_ImpListBase).super_type.field_0x2c;
      *(undefined8 *)&(first->super_ImpListBase).super_type.field_0x24 =
           *(undefined8 *)&(x->super_ImpListBase).super_type.field_0x24;
      *(undefined8 *)&(first->super_ImpListBase).super_type.field_0x2c = uVar3;
      *(undefined8 *)
       &(first->super_ImpListBase).super_type.
        super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.field_0x14
           = uVar1;
      *(undefined8 *)&(first->super_ImpListBase).super_type.field_0x1c = uVar2;
      left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U>::copy
                (&first->super_ImpListBase,(EVP_PKEY_CTX *)x,(EVP_PKEY_CTX *)pIVar4);
      (first->learnt)._M_b._M_p = (__pointer_type)0x0;
      LOCK();
      (first->learnt)._M_b._M_p = (x->learnt)._M_b._M_p;
      UNLOCK();
      pIVar4 = extraout_RDX_00;
switchD_00163aa8_caseD_6:
      first = pIVar5 + 1;
      uVar1 = *(undefined8 *)
               &(x->super_ImpListBase).super_type.
                super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                field_0x14;
      uVar2 = *(undefined8 *)&(x->super_ImpListBase).super_type.field_0x1c;
      uVar3 = *(undefined8 *)&(x->super_ImpListBase).super_type.field_0x2c;
      *(undefined8 *)&(pIVar5->super_ImpListBase).super_type.field_0x24 =
           *(undefined8 *)&(x->super_ImpListBase).super_type.field_0x24;
      *(undefined8 *)&(pIVar5->super_ImpListBase).super_type.field_0x2c = uVar3;
      *(undefined8 *)
       &(pIVar5->super_ImpListBase).super_type.
        super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.field_0x14
           = uVar1;
      *(undefined8 *)&(pIVar5->super_ImpListBase).super_type.field_0x1c = uVar2;
      left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U>::copy
                (&pIVar5->super_ImpListBase,(EVP_PKEY_CTX *)x,(EVP_PKEY_CTX *)pIVar4);
      (pIVar5->learnt)._M_b._M_p = (__pointer_type)0x0;
      LOCK();
      (pIVar5->learnt)._M_b._M_p = (x->learnt)._M_b._M_p;
      UNLOCK();
      pIVar4 = extraout_RDX_01;
switchD_00163aa8_caseD_5:
      pIVar5 = first + 1;
      uVar1 = *(undefined8 *)
               &(x->super_ImpListBase).super_type.
                super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                field_0x14;
      uVar2 = *(undefined8 *)&(x->super_ImpListBase).super_type.field_0x1c;
      uVar3 = *(undefined8 *)&(x->super_ImpListBase).super_type.field_0x2c;
      *(undefined8 *)&(first->super_ImpListBase).super_type.field_0x24 =
           *(undefined8 *)&(x->super_ImpListBase).super_type.field_0x24;
      *(undefined8 *)&(first->super_ImpListBase).super_type.field_0x2c = uVar3;
      *(undefined8 *)
       &(first->super_ImpListBase).super_type.
        super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.field_0x14
           = uVar1;
      *(undefined8 *)&(first->super_ImpListBase).super_type.field_0x1c = uVar2;
      left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U>::copy
                (&first->super_ImpListBase,(EVP_PKEY_CTX *)x,(EVP_PKEY_CTX *)pIVar4);
      (first->learnt)._M_b._M_p = (__pointer_type)0x0;
      LOCK();
      (first->learnt)._M_b._M_p = (x->learnt)._M_b._M_p;
      UNLOCK();
      pIVar4 = extraout_RDX_02;
switchD_00163aa8_caseD_4:
      first = pIVar5 + 1;
      uVar1 = *(undefined8 *)
               &(x->super_ImpListBase).super_type.
                super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                field_0x14;
      uVar2 = *(undefined8 *)&(x->super_ImpListBase).super_type.field_0x1c;
      uVar3 = *(undefined8 *)&(x->super_ImpListBase).super_type.field_0x2c;
      *(undefined8 *)&(pIVar5->super_ImpListBase).super_type.field_0x24 =
           *(undefined8 *)&(x->super_ImpListBase).super_type.field_0x24;
      *(undefined8 *)&(pIVar5->super_ImpListBase).super_type.field_0x2c = uVar3;
      *(undefined8 *)
       &(pIVar5->super_ImpListBase).super_type.
        super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.field_0x14
           = uVar1;
      *(undefined8 *)&(pIVar5->super_ImpListBase).super_type.field_0x1c = uVar2;
      left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U>::copy
                (&pIVar5->super_ImpListBase,(EVP_PKEY_CTX *)x,(EVP_PKEY_CTX *)pIVar4);
      (pIVar5->learnt)._M_b._M_p = (__pointer_type)0x0;
      LOCK();
      (pIVar5->learnt)._M_b._M_p = (x->learnt)._M_b._M_p;
      UNLOCK();
      pIVar4 = extraout_RDX_03;
switchD_00163aa8_caseD_3:
      pIVar5 = first + 1;
      uVar1 = *(undefined8 *)
               &(x->super_ImpListBase).super_type.
                super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                field_0x14;
      uVar2 = *(undefined8 *)&(x->super_ImpListBase).super_type.field_0x1c;
      uVar3 = *(undefined8 *)&(x->super_ImpListBase).super_type.field_0x2c;
      *(undefined8 *)&(first->super_ImpListBase).super_type.field_0x24 =
           *(undefined8 *)&(x->super_ImpListBase).super_type.field_0x24;
      *(undefined8 *)&(first->super_ImpListBase).super_type.field_0x2c = uVar3;
      *(undefined8 *)
       &(first->super_ImpListBase).super_type.
        super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.field_0x14
           = uVar1;
      *(undefined8 *)&(first->super_ImpListBase).super_type.field_0x1c = uVar2;
      left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U>::copy
                (&first->super_ImpListBase,(EVP_PKEY_CTX *)x,(EVP_PKEY_CTX *)pIVar4);
      (first->learnt)._M_b._M_p = (__pointer_type)0x0;
      LOCK();
      (first->learnt)._M_b._M_p = (x->learnt)._M_b._M_p;
      UNLOCK();
      pIVar4 = extraout_RDX_04;
switchD_00163aa8_caseD_2:
      first = pIVar5 + 1;
      uVar1 = *(undefined8 *)
               &(x->super_ImpListBase).super_type.
                super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                field_0x14;
      uVar2 = *(undefined8 *)&(x->super_ImpListBase).super_type.field_0x1c;
      uVar3 = *(undefined8 *)&(x->super_ImpListBase).super_type.field_0x2c;
      *(undefined8 *)&(pIVar5->super_ImpListBase).super_type.field_0x24 =
           *(undefined8 *)&(x->super_ImpListBase).super_type.field_0x24;
      *(undefined8 *)&(pIVar5->super_ImpListBase).super_type.field_0x2c = uVar3;
      *(undefined8 *)
       &(pIVar5->super_ImpListBase).super_type.
        super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.field_0x14
           = uVar1;
      *(undefined8 *)&(pIVar5->super_ImpListBase).super_type.field_0x1c = uVar2;
      left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U>::copy
                (&pIVar5->super_ImpListBase,(EVP_PKEY_CTX *)x,(EVP_PKEY_CTX *)pIVar4);
      (pIVar5->learnt)._M_b._M_p = (__pointer_type)0x0;
      LOCK();
      (pIVar5->learnt)._M_b._M_p = (x->learnt)._M_b._M_p;
      UNLOCK();
      pIVar4 = extraout_RDX_05;
switchD_00163aa8_caseD_1:
      pIVar5 = first + 1;
      uVar1 = *(undefined8 *)
               &(x->super_ImpListBase).super_type.
                super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                field_0x14;
      uVar2 = *(undefined8 *)&(x->super_ImpListBase).super_type.field_0x1c;
      uVar3 = *(undefined8 *)&(x->super_ImpListBase).super_type.field_0x2c;
      *(undefined8 *)&(first->super_ImpListBase).super_type.field_0x24 =
           *(undefined8 *)&(x->super_ImpListBase).super_type.field_0x24;
      *(undefined8 *)&(first->super_ImpListBase).super_type.field_0x2c = uVar3;
      *(undefined8 *)
       &(first->super_ImpListBase).super_type.
        super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.field_0x14
           = uVar1;
      *(undefined8 *)&(first->super_ImpListBase).super_type.field_0x1c = uVar2;
      left_right_sequence<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>,_56U>::copy
                (&first->super_ImpListBase,(EVP_PKEY_CTX *)x,(EVP_PKEY_CTX *)pIVar4);
      (first->learnt)._M_b._M_p = (__pointer_type)0x0;
      LOCK();
      (first->learnt)._M_b._M_p = (x->learnt)._M_b._M_p;
      UNLOCK();
      pIVar4 = extraout_RDX_06;
    }
    break;
  case 1:
    goto switchD_00163aa8_caseD_1;
  case 2:
    goto switchD_00163aa8_caseD_2;
  case 3:
    goto switchD_00163aa8_caseD_3;
  case 4:
    goto switchD_00163aa8_caseD_4;
  case 5:
    goto switchD_00163aa8_caseD_5;
  case 6:
    goto switchD_00163aa8_caseD_6;
  case 7:
    goto switchD_00163aa8_caseD_7;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}